

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.c
# Opt level: O3

void gb_timer_tick(Timer *timer,MemoryBankController *mc)

{
  uint8_t uVar1;
  _Bool _Var2;
  int iVar3;
  
  iVar3 = *(int *)&mc->div_register + 4;
  mc->div_register = (uint16_t)iVar3;
  mc->memory[0xff04] = (uint8_t)((uint)iVar3 >> 8);
  if (timer->tima_has_overflowed == true) {
    uVar1 = (*mc->read)(mc,0xff06);
    (*mc->write)(mc,0xff05,uVar1);
    gb_request_interrupt(mc,Interrupts_Timer);
    timer->tima_has_overflowed = false;
  }
  _Var2 = gb_timer_should_increment_tima(timer,mc);
  if (_Var2) {
    uVar1 = (*mc->read)(mc,0xff05);
    _Var2 = overflows_8bit(uVar1,'\x01');
    if (_Var2) {
      timer->tima_has_overflowed = true;
    }
    mc->memory[0xff05] = uVar1 + '\x01';
  }
  return;
}

Assistant:

void gb_timer_tick(Timer* timer, MemoryBankController* mc) {

    mc->div_register += 4;
    mc->memory[DIV] = (uint8_t) (mc->div_register >> 8);

    if(timer->tima_has_overflowed) { 
        gb_timer_reset_tima(mc);
        gb_request_interrupt(mc, Interrupts_Timer);
        timer->tima_has_overflowed = false;
    }

    if(gb_timer_should_increment_tima(timer, mc)) {

        uint8_t tima_value = mc->read(mc, TIMA);
        if(overflows_8bit(tima_value, 1)) {
            timer->tima_has_overflowed = true;
        }
        
        tima_value++;
        mc->memory[TIMA] = tima_value;
    }

}